

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O2

void idx2::BuildSubbands(v3i *N3,int NLevels,u64 TransformOrder,array<idx2::subband> *Subbands)

{
  u64 *puVar1;
  byte *pbVar2;
  char cVar3;
  byte *pbVar4;
  subband *Beg;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  u64 uVar9;
  u64 uVar10;
  u64 uVar11;
  u64 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  byte bVar19;
  ulong uVar20;
  anon_union_2_4_6ba14846_for_v2<signed_char>_1 Count;
  dimension D;
  ulong uVar21;
  undefined8 *puVar22;
  long lVar23;
  uint uVar24;
  char cVar25;
  short sVar26;
  long lVar27;
  dimension dVar28;
  uint uVar29;
  bool bVar30;
  u64 auStack_4f48 [363];
  v3<signed_char> NextLevel3;
  v3<signed_char> MaxLevel3;
  v3<signed_char> NextLowHigh3;
  char local_43e4;
  subband local_43b8;
  grid_split Gs;
  stack_array<idx2::grid,_32> Grids;
  circular_queue<idx2::subband,_256> Queue;
  
  Subbands->Size = 0;
  GrowCapacity<idx2::subband>
            (Subbands,(long)(((NLevels <<
                              (1 < (N3->field_0).field_0.Z) +
                              (1 < (N3->field_0).field_0.Y) + (1 < (N3->field_0).field_0.X)) -
                             NLevels) + 1));
  circular_queue<idx2::subband,_256>::circular_queue(&Queue);
  Grids.Arr[0].super_extent.From = 0;
  Grids.Arr[0].super_extent.Dims =
       (ulong)((N3->field_0).field_0.Z & 0x1fffff) << 0x2a |
       ((ulong)(uint)(N3->field_0).field_0.Y & 0x1fffff) << 0x15 |
       (ulong)(uint)(N3->field_0).field_0.X & 0x1fffff;
  Grids.Arr[0].Strd = 0x40000200001;
  Grids.Arr[1].super_extent.From = 0;
  Grids.Arr[1].Strd = 0x40000200001;
  Grids.Arr[2].super_extent.From = 0;
  Grids.Arr[2].super_extent.Dims._0_2_ = 0;
  Grids.Arr[1].super_extent.Dims = Grids.Arr[0].super_extent.Dims;
  PushBack<idx2::subband,256>(&Queue,(subband *)&Grids);
  MaxLevel3.field_0.field_3.XY.field_0 =
       (v2<signed_char>)(anon_union_2_4_6ba14846_for_v2<signed_char>_1)0x0;
  MaxLevel3.field_0.field_0.Z = '\0';
  memset(&Grids,0,0x301);
  cVar25 = '\0';
  while( true ) {
    uVar20 = TransformOrder;
    while( true ) {
      if (NLevels <= cVar25) {
        sVar26 = (Queue.End - Queue.Start) + 0x100;
        if (Queue.Start <= Queue.End) {
          sVar26 = Queue.End - Queue.Start;
        }
        if (0 < sVar26) {
          bVar19 = (byte)Queue.Start;
          lVar23 = Subbands->Size;
          if (Subbands->Capacity <= lVar23) {
            GrowCapacity<idx2::subband>(Subbands,0);
            lVar23 = Subbands->Size;
          }
          Subbands->Size = lVar23 + 1;
          pbVar2 = (Subbands->Buffer).Data;
          uVar9 = Queue.Buffer.Arr[bVar19].Grid.super_extent.From;
          uVar10 = Queue.Buffer.Arr[bVar19].Grid.super_extent.Dims;
          uVar11 = Queue.Buffer.Arr[bVar19].Grid.Strd;
          uVar12 = Queue.Buffer.Arr[bVar19].AccumGrid.super_extent.From;
          uVar5 = *(undefined8 *)((long)&Queue.Buffer.Arr[bVar19].AccumGrid.super_extent.Dims + 2);
          uVar6 = *(undefined8 *)((long)&Queue.Buffer.Arr[bVar19].AccumGrid.Strd + 2);
          uVar7 = *(undefined8 *)((long)&Queue.Buffer.Arr[bVar19].Level3.field_0 + 2);
          pbVar4 = pbVar2 + lVar23 * 0x40 + 0x1a;
          *(undefined8 *)pbVar4 =
               *(undefined8 *)((long)&Queue.Buffer.Arr[bVar19].AccumGrid.super_extent.From + 2);
          *(undefined8 *)(pbVar4 + 8) = uVar5;
          *(undefined8 *)(pbVar4 + 0x10) = uVar6;
          *(undefined8 *)(pbVar4 + 0x18) = uVar7;
          puVar1 = (u64 *)(pbVar2 + lVar23 * 0x40);
          *puVar1 = uVar9;
          puVar1[1] = uVar10;
          puVar1[2] = uVar11;
          puVar1[3] = uVar12;
        }
        Reverse<idx2::grid*>(Grids.Arr,Grids.Arr + (long)cVar25 + 1);
        uVar18 = MaxLevel3.field_0.field_0.Z;
        uVar16 = MaxLevel3.field_0.field_0.X;
        uVar17 = MaxLevel3.field_0.field_0.Y;
        lVar27 = 0;
        lVar23 = Subbands->Size;
        if (Subbands->Size < 1) {
          lVar23 = lVar27;
        }
        while( true ) {
          Beg = (subband *)(Subbands->Buffer).Data;
          bVar30 = lVar23 == 0;
          lVar23 = lVar23 + -1;
          if (bVar30) {
            Reverse<idx2::subband*>(Beg,Beg + Subbands->Size);
            return;
          }
          cVar25 = (Beg->Level3Rev).field_0.E[lVar27];
          cVar3 = (Beg->Level3Rev).field_0.E[lVar27 + 1];
          (Beg->Level3).field_0.E[lVar27 + 2] = uVar18 - (Beg->Level3Rev).field_0.E[lVar27 + 2];
          *(ushort *)((long)&(Beg->Level3).field_0 + lVar27) =
               CONCAT11(uVar17 - cVar3,uVar16 - cVar25);
          local_43e4 = (char)NLevels;
          local_43e4 = ~(&Beg->Level)[lVar27] + local_43e4;
          (&Beg->Level)[lVar27] = local_43e4;
          if ('\x1f' < local_43e4) break;
          MergeSubbandGrids(&local_43b8.Grid,Grids.Arr + local_43e4,
                            (grid *)((long)&(Beg->Grid).super_extent.From + lVar27));
          *(u64 *)((long)&(Beg->AccumGrid).Strd + lVar27) = local_43b8.Grid.Strd;
          puVar1 = (u64 *)((long)&(Beg->AccumGrid).super_extent.From + lVar27);
          *puVar1 = local_43b8.Grid.super_extent.From;
          puVar1[1] = local_43b8.Grid.super_extent.Dims;
          lVar27 = lVar27 + 0x40;
        }
        goto LAB_0016f257;
      }
      dVar28 = (dimension)uVar20;
      D = dVar28 & (Z|Y);
      uVar20 = uVar20 >> 2;
      if (D == (Z|Y)) break;
      sVar26 = (Queue.End - Queue.Start) + 0x100;
      if (Queue.Start <= Queue.End) {
        sVar26 = Queue.End - Queue.Start;
      }
      dVar28 = dVar28 & (Z|Y);
      MaxLevel3.field_0.E[dVar28] = MaxLevel3.field_0.E[dVar28] + '\x01';
      if (sVar26 < 1) {
        sVar26 = 0;
      }
      while (bVar30 = sVar26 != 0, sVar26 = sVar26 + -1, bVar30) {
        SplitAlternate(&Gs,&Queue.Buffer.Arr[(byte)Queue.Start].Grid,D);
        uVar21 = (ulong)(byte)Queue.Start;
        NextLevel3.field_0.field_3.XY.field_0 =
             (v2<signed_char>)
             (v2<signed_char>)Queue.Buffer.Arr[uVar21].Level3.field_0.field_3.XY.field_0;
        NextLevel3.field_0.field_0.Z = Queue.Buffer.Arr[uVar21].Level3.field_0.field_0.Z;
        NextLevel3.field_0.E[dVar28] = NextLevel3.field_0.E[dVar28] + '\x01';
        NextLowHigh3.field_0.field_0.Z = Queue.Buffer.Arr[uVar21].LowHigh3.field_0.field_0.Z;
        NextLowHigh3.field_0.field_3.XY.field_0 =
             (v2<signed_char>)
             (v2<signed_char>)Queue.Buffer.Arr[uVar21].LowHigh3.field_0.field_3.XY.field_0;
        NextLowHigh3.field_0.E[dVar28] = '\x01';
        local_43b8.Grid.Strd = Gs.First.Strd;
        local_43b8.Grid.super_extent.From = Gs.First.super_extent.From;
        local_43b8.Grid.super_extent.Dims = Gs.First.super_extent.Dims;
        local_43b8.AccumGrid.Strd = Gs.First.Strd;
        local_43b8.AccumGrid.super_extent.From = Gs.First.super_extent.From;
        local_43b8.AccumGrid.super_extent.Dims = Gs.First.super_extent.Dims;
        local_43b8.Level3.field_0.field_0.Z = NextLevel3.field_0.field_0.Z;
        local_43b8.Level3.field_0.field_3.XY.field_0 = NextLevel3.field_0.field_3.XY.field_0;
        local_43b8.Level3Rev.field_0.field_0.Z = NextLevel3.field_0.field_0.Z;
        local_43b8.Level3Rev.field_0.field_3.XY.field_0 = NextLevel3.field_0.field_3.XY.field_0;
        local_43b8.LowHigh3.field_0.field_0.Z = Queue.Buffer.Arr[uVar21].LowHigh3.field_0.field_0.Z;
        local_43b8.LowHigh3.field_0.field_3.XY.field_0 =
             (v2<signed_char>)Queue.Buffer.Arr[uVar21].LowHigh3.field_0.field_3.XY.field_0;
        local_43b8.Level = cVar25;
        PushBack<idx2::subband,256>(&Queue,&local_43b8);
        local_43b8.Grid.Strd = Gs.Second.Strd;
        local_43b8.Grid.super_extent.From = Gs.Second.super_extent.From;
        local_43b8.Grid.super_extent.Dims = Gs.Second.super_extent.Dims;
        local_43b8.AccumGrid.Strd = Gs.Second.Strd;
        local_43b8.AccumGrid.super_extent.From = Gs.Second.super_extent.From;
        local_43b8.AccumGrid.super_extent.Dims = Gs.Second.super_extent.Dims;
        uVar21 = (ulong)(byte)Queue.Start;
        local_43b8.Level3.field_0.field_0.Z = Queue.Buffer.Arr[uVar21].Level3.field_0.field_0.Z;
        local_43b8.Level3.field_0.field_3.XY.field_0 =
             (v2<signed_char>)
             (v2<signed_char>)Queue.Buffer.Arr[uVar21].Level3.field_0.field_3.XY.field_0;
        Count = Queue.Buffer.Arr[uVar21].Level3.field_0.field_3.XY.field_0;
        local_43b8.Level3Rev.field_0.field_3.XY.field_0 = (v2<signed_char>)(v2<signed_char>)Count;
        local_43b8.Level3Rev.field_0.field_0.Z = Queue.Buffer.Arr[uVar21].Level3.field_0.field_0.Z;
        local_43b8.LowHigh3.field_0.field_3.XY.field_0 = NextLowHigh3.field_0.field_3.XY.field_0;
        local_43b8.LowHigh3.field_0.field_0.Z = NextLowHigh3.field_0.field_0.Z;
        local_43b8.Level = cVar25;
        PushBack<idx2::subband,256>(&Queue,&local_43b8);
        PopFront<idx2::subband,256>
                  (&local_43b8,(idx2 *)&Queue,(circular_queue<idx2::subband,_256> *)0x1,(i16)Count);
      }
    }
    uVar29 = (ushort)(Queue.End - Queue.Start) + 0x100;
    if (Queue.Start <= Queue.End) {
      uVar29 = (uint)(ushort)(Queue.End - Queue.Start);
    }
    uVar29 = uVar29 & 0xffff;
    while (uVar29 = uVar29 - 1, 0 < (short)uVar29) {
      uVar24 = Queue._16392_4_ + uVar29;
      lVar23 = Subbands->Size;
      if (Subbands->Capacity <= lVar23) {
        GrowCapacity<idx2::subband>(Subbands,0);
        lVar23 = Subbands->Size;
      }
      uVar21 = (ulong)((uVar24 & 0xff) << 6);
      puVar22 = (undefined8 *)((long)&Queue.Buffer.Arr[0].Grid.super_extent.From + uVar21);
      Subbands->Size = lVar23 + 1;
      pbVar4 = (Subbands->Buffer).Data;
      uVar5 = *puVar22;
      uVar6 = *(undefined8 *)((long)&Queue.Buffer.Arr[0].Grid.super_extent.Dims + uVar21);
      uVar7 = *(undefined8 *)((long)&Queue.Buffer.Arr[0].Grid.Strd + uVar21);
      uVar8 = *(undefined8 *)((long)&Queue.Buffer.Arr[0].AccumGrid.super_extent.From + uVar21);
      uVar13 = *(undefined8 *)((long)&Queue.Buffer.Arr[0].AccumGrid.super_extent.Dims + uVar21 + 2);
      uVar14 = *(undefined8 *)((long)&Queue.Buffer.Arr[0].AccumGrid.Strd + uVar21 + 2);
      uVar15 = *(undefined8 *)((long)&Queue.Buffer.Arr[0].Level3.field_0 + uVar21 + 2);
      pbVar2 = pbVar4 + lVar23 * 0x40 + 0x1a;
      *(undefined8 *)pbVar2 =
           *(undefined8 *)((long)&Queue.Buffer.Arr[0].AccumGrid.super_extent.From + uVar21 + 2);
      *(undefined8 *)(pbVar2 + 8) = uVar13;
      *(undefined8 *)(pbVar2 + 0x10) = uVar14;
      *(undefined8 *)(pbVar2 + 0x18) = uVar15;
      pbVar4 = pbVar4 + lVar23 * 0x40;
      *(undefined8 *)pbVar4 = uVar5;
      *(undefined8 *)(pbVar4 + 8) = uVar6;
      *(undefined8 *)(pbVar4 + 0x10) = uVar7;
      *(undefined8 *)(pbVar4 + 0x18) = uVar8;
      PopBack<idx2::subband,256>
                (&local_43b8,(idx2 *)&Queue,(circular_queue<idx2::subband,_256> *)0x1,(i16)puVar22);
    }
    cVar25 = cVar25 + '\x01';
    if ('\x1f' < cVar25) break;
    if (uVar20 != 3) {
      TransformOrder = uVar20;
    }
    uVar20 = (ulong)(byte)Queue.Start;
    Grids.Arr[cVar25].Strd = Queue.Buffer.Arr[uVar20].Grid.Strd;
    uVar9 = Queue.Buffer.Arr[uVar20].Grid.super_extent.Dims;
    Grids.Arr[cVar25].super_extent.From = Queue.Buffer.Arr[uVar20].Grid.super_extent.From;
    Grids.Arr[cVar25].super_extent.Dims = uVar9;
  }
LAB_0016f257:
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x20c,
                "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
               );
}

Assistant:

void
BuildSubbands(const v3i& N3, int NLevels, u64 TransformOrder, array<subband>* Subbands)
{
  Clear(Subbands);
  Reserve(Subbands, ((1 << NumDims(N3)) - 1) * NLevels + 1);
  circular_queue<subband, 256> Queue;
  PushBack(&Queue, subband{ grid(N3), grid(N3), v3<i8>(0), v3<i8>(0), v3<i8>(0), i8(0) });
  i8 Level = 0;
  u64 PrevOrder = TransformOrder;
  v3<i8> MaxLevel3(0);
  stack_array<grid, 32> Grids;
  while (Level < NLevels)
  {
    idx2_Assert(TransformOrder != 0);
    int D = TransformOrder & 0x3;
    TransformOrder >>= 2;
    if (D == 3)
    {                          // next level
      if (TransformOrder == 3) // next one is the last +
        TransformOrder = PrevOrder;
      else
        PrevOrder = TransformOrder;
      i16 Sz = Size(Queue);
      for (i16 I = Sz - 1; I >= 1; --I)
      {
        PushBack(Subbands, Queue[I]);
        PopBack(&Queue);
      }
      ++Level;
      Grids[Level] = Queue[0].Grid;
    }
    else
    {
      ++MaxLevel3[D];
      i16 Sz = Size(Queue);
      for (i16 I = 0; I < Sz; ++I)
      {
        const grid& G = Queue[0].Grid;
        grid_split Gs = SplitAlternate(G, dimension(D));
        v3<i8> NextLevel3 = Queue[0].Level3;
        ++NextLevel3[D];
        v3<i8> NextLowHigh3 = Queue[0].LowHigh3;
        idx2_Assert(NextLowHigh3[D] == 0);
        NextLowHigh3[D] = 1;
        PushBack(&Queue,
                 subband{ Gs.First, Gs.First, NextLevel3, NextLevel3, Queue[0].LowHigh3, Level });
        PushBack(
          &Queue,
          subband{ Gs.Second, Gs.Second, Queue[0].Level3, Queue[0].Level3, NextLowHigh3, Level });
        PopFront(&Queue);
      }
    }
  }
  if (Size(Queue) > 0)
    PushBack(Subbands, Queue[0]);
  Reverse(Begin(Grids), Begin(Grids) + Level + 1);
  i64 Sz = Size(*Subbands);
  for (i64 I = 0; I < Sz; ++I)
  {
    subband& Sband = (*Subbands)[I];
    Sband.Level3 = MaxLevel3 - Sband.Level3Rev;
    Sband.Level = i8(NLevels - Sband.Level - 1);
    Sband.AccumGrid = MergeSubbandGrids(Grids[Sband.Level], Sband.Grid);
  }
  Reverse(Begin(*Subbands), End(*Subbands));
}